

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O3

void resetModelStatusAndHighsInfo(HighsLpSolverObject *solver_object)

{
  HighsInfo *pHVar1;
  
  solver_object->model_status_ = kMin;
  pHVar1 = solver_object->highs_info_;
  (pHVar1->super_HighsInfoStruct).objective_function_value = 0.0;
  (pHVar1->super_HighsInfoStruct).primal_solution_status = 0;
  (pHVar1->super_HighsInfoStruct).dual_solution_status = 0;
  (pHVar1->super_HighsInfoStruct).num_primal_infeasibilities = -1;
  (pHVar1->super_HighsInfoStruct).max_primal_infeasibility = INFINITY;
  (pHVar1->super_HighsInfoStruct).sum_primal_infeasibilities = INFINITY;
  (pHVar1->super_HighsInfoStruct).num_dual_infeasibilities = -1;
  (pHVar1->super_HighsInfoStruct).max_dual_infeasibility = INFINITY;
  (pHVar1->super_HighsInfoStruct).sum_dual_infeasibilities = INFINITY;
  return;
}

Assistant:

void resetModelStatusAndHighsInfo(HighsLpSolverObject& solver_object) {
  solver_object.model_status_ = HighsModelStatus::kNotset;
  solver_object.highs_info_.objective_function_value = 0;
  solver_object.highs_info_.primal_solution_status = kSolutionStatusNone;
  solver_object.highs_info_.dual_solution_status = kSolutionStatusNone;
  solver_object.highs_info_.num_primal_infeasibilities =
      kHighsIllegalInfeasibilityCount;
  solver_object.highs_info_.max_primal_infeasibility =
      kHighsIllegalInfeasibilityMeasure;
  solver_object.highs_info_.sum_primal_infeasibilities =
      kHighsIllegalInfeasibilityMeasure;
  solver_object.highs_info_.num_dual_infeasibilities =
      kHighsIllegalInfeasibilityCount;
  solver_object.highs_info_.max_dual_infeasibility =
      kHighsIllegalInfeasibilityMeasure;
  solver_object.highs_info_.sum_dual_infeasibilities =
      kHighsIllegalInfeasibilityMeasure;
}